

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.h
# Opt level: O0

void __thiscall
xemmai::t_parser::t_error::t_error
          (t_error *this,wstring_view a_message,wstring_view a_path,t_at *a_at)

{
  allocator<wchar_t> local_9d [20];
  allocator<wchar_t> local_89;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_88;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_68;
  __sv_type local_48;
  t_at *local_38;
  t_at *a_at_local;
  t_error *this_local;
  wstring_view a_path_local;
  wstring_view a_message_local;
  
  a_path_local._M_len = (size_t)a_path._M_str;
  this_local = (t_error *)a_path._M_len;
  a_path_local._M_str = (wchar_t *)a_message._M_len;
  local_38 = a_at;
  a_at_local = (t_at *)this;
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::basic_string_view<wchar_t,std::char_traits<wchar_t>>,void>
            ((wstring *)&local_88,
             (basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)&a_path_local._M_str,
             &local_89);
  std::operator+(&local_68,L"syntax error: ",&local_88);
  local_48 = std::__cxx11::wstring::operator_cast_to_basic_string_view((wstring *)&local_68);
  t_throwable::t_throwable(&this->super_t_throwable,local_48);
  std::__cxx11::wstring::~wstring((wstring *)&local_68);
  std::__cxx11::wstring::~wstring((wstring *)&local_88);
  std::allocator<wchar_t>::~allocator(&local_89);
  (this->super_t_throwable)._vptr_t_throwable = (_func_int **)&PTR__t_error_002e5a00;
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::basic_string_view<wchar_t,std::char_traits<wchar_t>>,void>
            ((wstring *)&this->v_path,
             (basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)&this_local,local_9d);
  std::allocator<wchar_t>::~allocator(local_9d);
  (this->v_at).v_position = local_38->v_position;
  (this->v_at).v_line = local_38->v_line;
  (this->v_at).v_column = local_38->v_column;
  return;
}

Assistant:

t_error(std::wstring_view a_message, std::wstring_view a_path, const t_at& a_at) : t_throwable(L"syntax error: " + std::wstring(a_message)), v_path(a_path), v_at(a_at)
		{
		}